

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O3

EStatusCode __thiscall
AbstractContentContext::WriteTextCommandWithDirectGlyphSelection
          (AbstractContentContext *this,GlyphUnicodeMappingList *inText,ITextCommand *inTextCommand)

{
  GraphicStateStack *this_00;
  _List_node_base *p_Var1;
  size_t __n;
  EStatusCode EVar2;
  int iVar3;
  GraphicState *pGVar4;
  Trace *pTVar5;
  undefined4 extraout_var;
  _List_node_base *p_Var6;
  bool writeAsCID;
  char formattingBuffer [5];
  ObjectIDType fontObjectID;
  OutputStringBufferStream stringStream;
  string fontName;
  UShortList encodedCharactersList;
  bool local_b6;
  Byte local_b5 [5];
  string local_b0;
  ObjectIDType local_90;
  OutputStringBufferStream local_88;
  double local_70;
  string local_68;
  _List_node_base local_48;
  undefined8 local_38;
  
  this_00 = &this->mGraphicStack;
  pGVar4 = GraphicStateStack::GetCurrentState(this_00);
  if (pGVar4->mFont == (PDFUsedFont *)0x0) {
    pTVar5 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar5,
                      "AbstractContentContext::WriteTextCommandWithDirectGlyphSelection, Cannot write text, no current font is defined"
                     );
    return eFailure;
  }
  local_38 = 0;
  local_48._M_next = &local_48;
  local_48._M_prev = &local_48;
  EVar2 = PDFUsedFont::EncodeStringForShowing
                    (pGVar4->mFont,inText,&local_90,(UShortList *)&local_48,&local_b6);
  if (EVar2 != eSuccess) {
    pTVar5 = Trace::DefaultTrace();
    EVar2 = eFailure;
    Trace::TraceToLog(pTVar5,
                      "AbstractcontextContext::WriteTextCommandWithDirectGlyphSelection, Unexepcted failure, Cannot encode characters"
                     );
    p_Var6 = local_48._M_next;
    goto joined_r0x00197a92;
  }
  EVar2 = eSuccess;
  p_Var6 = local_48._M_next;
  if ((local_48._M_next == &local_48) || (local_90 == 0)) goto joined_r0x00197a92;
  iVar3 = (*this->_vptr_AbstractContentContext[2])(this);
  ResourcesDictionary::AddFontMapping_abi_cxx11_
            (&local_68,(ResourcesDictionary *)CONCAT44(extraout_var,iVar3),local_90);
  pGVar4 = GraphicStateStack::GetCurrentState(this_00);
  __n = (pGVar4->mPlacedFontName)._M_string_length;
  if ((__n == local_68._M_string_length) &&
     ((__n == 0 ||
      (iVar3 = bcmp((pGVar4->mPlacedFontName)._M_dataplus._M_p,local_68._M_dataplus._M_p,__n),
      iVar3 == 0)))) {
    pGVar4 = GraphicStateStack::GetCurrentState(this_00);
    local_70 = pGVar4->mPlacedFontSize;
    pGVar4 = GraphicStateStack::GetCurrentState(this_00);
    if ((local_70 != pGVar4->mFontSize) || (NAN(local_70) || NAN(pGVar4->mFontSize)))
    goto LAB_00197b5a;
  }
  else {
LAB_00197b5a:
    pGVar4 = GraphicStateStack::GetCurrentState(this_00);
    TfLow(this,&local_68,pGVar4->mFontSize);
  }
  OutputStringBufferStream::OutputStringBufferStream(&local_88);
  if (local_b6 == false) {
    if (local_48._M_next != &local_48) {
      p_Var6 = local_48._M_next;
      do {
        local_b5[0] = *(Byte *)&p_Var6[1]._M_next;
        OutputStringBufferStream::Write(&local_88,local_b5,1);
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != &local_48);
    }
    OutputStringBufferStream::ToString_abi_cxx11_(&local_b0,&local_88);
    (*inTextCommand->_vptr_ITextCommand[1])(inTextCommand,&local_b0);
  }
  else {
    if (local_48._M_next != &local_48) {
      p_Var6 = local_48._M_next;
      do {
        local_b5[0] = *(Byte *)((long)&p_Var6[1]._M_next + 1);
        OutputStringBufferStream::Write(&local_88,local_b5,1);
        local_b5[0] = *(Byte *)&p_Var6[1]._M_next;
        OutputStringBufferStream::Write(&local_88,local_b5,1);
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != &local_48);
    }
    OutputStringBufferStream::ToString_abi_cxx11_(&local_b0,&local_88);
    (**inTextCommand->_vptr_ITextCommand)(inTextCommand,&local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  OutputStringBufferStream::~OutputStringBufferStream(&local_88);
  p_Var6 = local_48._M_next;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    p_Var6 = local_48._M_next;
  }
joined_r0x00197a92:
  while (p_Var6 != &local_48) {
    p_Var1 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var6->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var6,0x18);
    p_Var6 = p_Var1;
  }
  return EVar2;
}

Assistant:

EStatusCode AbstractContentContext::WriteTextCommandWithDirectGlyphSelection(const GlyphUnicodeMappingList& inText,ITextCommand* inTextCommand)
{
	PDFUsedFont* currentFont = GetCurrentFont();
	if(!currentFont)
	{
		TRACE_LOG("AbstractContentContext::WriteTextCommandWithDirectGlyphSelection, Cannot write text, no current font is defined");
		return PDFHummus::eFailure;
	}

	ObjectIDType fontObjectID;
	UShortList encodedCharactersList;
	bool writeAsCID;	

	if(currentFont->EncodeStringForShowing(inText,fontObjectID,encodedCharactersList,writeAsCID) != PDFHummus::eSuccess)
	{
		TRACE_LOG("AbstractcontextContext::WriteTextCommandWithDirectGlyphSelection, Unexepcted failure, Cannot encode characters");
		return PDFHummus::eFailure;
	}
	
	// skip if there's no text going to be written (also means no font ID)
	if(encodedCharactersList.empty() || 0 == fontObjectID)
		return PDFHummus::eSuccess;

	// Write the font reference (only if required)
	std::string fontName = GetResourcesDictionary()->AddFontMapping(fontObjectID);

	if(mGraphicStack.GetCurrentState().mPlacedFontName != fontName ||
		mGraphicStack.GetCurrentState().mPlacedFontSize != mGraphicStack.GetCurrentState().mFontSize)
		TfLow(fontName,mGraphicStack.GetCurrentState().mFontSize);
	
	// Now write the string using the text command
	OutputStringBufferStream stringStream;
	char formattingBuffer[5];
	UShortList::iterator it = encodedCharactersList.begin();
	if(writeAsCID)
	{
		for(;it!= encodedCharactersList.end();++it)
		{
			formattingBuffer[0] = ((*it) >> 8) & 0x00ff;
			stringStream.Write((const Byte*)formattingBuffer, 1);
			formattingBuffer[0] = (*it) & 0x00ff;
			stringStream.Write((const Byte*)formattingBuffer, 1);
		}
		inTextCommand->WriteHexStringCommand(stringStream.ToString());
	}
	else
	{
		for(;it!= encodedCharactersList.end();++it)
		{
			formattingBuffer[0] = (*it) & 0x00ff;
			stringStream.Write((const Byte*)formattingBuffer,1);
		}
		inTextCommand->WriteLiteralStringCommand(stringStream.ToString());	
	}
	return PDFHummus::eSuccess;
}